

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_specialspot.cpp
# Opt level: O1

int AF_DSpotState_GetNextInList
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  DSpotState *this;
  PClassActor *type;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  FSpotList *this_00;
  ASpecialSpot *val;
  PClassActor *pPVar4;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  
  pPVar1 = DSpotState::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      this = (DSpotState *)(param->field_0).field_1.a;
      if (this != (DSpotState *)0x0) {
        if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (this->super_DThinker).super_DObject.Class;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar7) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar7 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DSpotState))";
          goto LAB_004bd807;
        }
      }
      if (numparam == 1) {
        pcVar5 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          type = (PClassActor *)param[1].field_0.field_1.a;
          if ((type != (PClassActor *)0x0) &&
             (pPVar4 = type, type != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
            do {
              pPVar4 = (PClassActor *)(pPVar4->super_PClass).ParentClass;
              if (pPVar4 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
            } while (pPVar4 != (PClassActor *)0x0);
            if (pPVar4 == (PClassActor *)0x0) {
              pcVar5 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_004bd845;
            }
          }
          if (numparam < 3) {
            pcVar5 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\0') {
              iVar2 = param[2].field_0.i;
              this_00 = DSpotState::FindSpotList(this,type);
              iVar6 = 0;
              if (this_00 == (FSpotList *)0x0) {
                val = (ASpecialSpot *)0x0;
              }
              else {
                val = FSpotList::GetNextInList(this_00,iVar2);
              }
              if (0 < numret) {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                                ,0x14c,
                                "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                iVar6 = 1;
                VMReturn::SetPointer(ret,val,1);
              }
              return iVar6;
            }
            pcVar5 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                        ,0x14b,
                        "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar5 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_004bd845:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                    ,0x14a,
                    "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_004bd807:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                ,0x149,
                "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DSpotState, GetNextInList)
{
	PARAM_SELF_PROLOGUE(DSpotState);
	PARAM_CLASS(type, AActor);
	PARAM_INT(skipcounter);
	ACTION_RETURN_OBJECT(self->GetNextInList(type, skipcounter));
}